

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_string_field.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::cpp::RepeatedStringFieldGenerator::GenerateByteSize
          (RepeatedStringFieldGenerator *this,Printer *printer)

{
  io::Printer::Print(printer,&this->variables_,
                     "total_size += $tag_size$ * this->$name$_size();\nfor (int i = 0; i < this->$name$_size(); i++) {\n  total_size += ::google::protobuf::internal::WireFormatLite::$declared_type$Size(\n    this->$name$(i));\n}\n"
                    );
  return;
}

Assistant:

void RepeatedStringFieldGenerator::
GenerateByteSize(io::Printer* printer) const {
  printer->Print(variables_,
    "total_size += $tag_size$ * this->$name$_size();\n"
    "for (int i = 0; i < this->$name$_size(); i++) {\n"
    "  total_size += ::google::protobuf::internal::WireFormatLite::$declared_type$Size(\n"
    "    this->$name$(i));\n"
    "}\n");
}